

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_segment.cpp
# Opt level: O2

void duckdb::SwapTupleDataSegment(TupleDataSegment *a,TupleDataSegment *b)

{
  TupleDataLayout *pTVar1;
  idx_t iVar2;
  
  ::std::swap<duckdb::shared_ptr<duckdb::TupleDataAllocator,true>>(&a->allocator,&b->allocator);
  pTVar1 = (a->layout)._M_data;
  (a->layout)._M_data = (b->layout)._M_data;
  (b->layout)._M_data = pTVar1;
  ::std::swap<duckdb::vector<duckdb::TupleDataChunk,false>>(&a->chunks,&b->chunks);
  ::std::swap<duckdb::vector<duckdb::TupleDataChunkPart,false>>(&a->chunk_parts,&b->chunk_parts);
  iVar2 = a->count;
  a->count = b->count;
  b->count = iVar2;
  iVar2 = a->data_size;
  a->data_size = b->data_size;
  b->data_size = iVar2;
  ::std::swap<duckdb::vector<duckdb::BufferHandle,false>>
            (&a->pinned_row_handles,&b->pinned_row_handles);
  ::std::swap<duckdb::vector<duckdb::BufferHandle,false>>
            (&a->pinned_heap_handles,&b->pinned_heap_handles);
  return;
}

Assistant:

void SwapTupleDataSegment(TupleDataSegment &a, TupleDataSegment &b) {
	std::swap(a.allocator, b.allocator);
	std::swap(a.layout, b.layout);
	std::swap(a.chunks, b.chunks);
	std::swap(a.chunk_parts, b.chunk_parts);
	std::swap(a.count, b.count);
	std::swap(a.data_size, b.data_size);
	std::swap(a.pinned_row_handles, b.pinned_row_handles);
	std::swap(a.pinned_heap_handles, b.pinned_heap_handles);
}